

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshChannelControl.cpp
# Opt level: O2

void __thiscall
TPZMHMixedMeshChannelControl::BuildComputationalMesh
          (TPZMHMixedMeshChannelControl *this,bool usersubstructure,bool OpenChannel,
          map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
          *oppen_channel)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long *plVar3;
  TPZCompEl *pTVar4;
  TPZCompEl *pTVar5;
  TPZCompMesh *pTVar6;
  TPZMHMixedMeshControl *pTVar7;
  TPZGeoEl *pTVar8;
  TPZGeoEl *pTVar9;
  long lVar10;
  long lVar11;
  TPZConnect *this_00;
  TPZConnect *this_01;
  undefined8 uVar12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  int64_t iVar15;
  int iVar16;
  undefined7 in_register_00000031;
  int iVar17;
  TPZAutoPointer<TPZCompMesh> local_58;
  undefined4 local_4c;
  TPZMHMixedMeshControl *local_48;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,usersubstructure);
  if ((*(int *)(this + 0xb0) == 0) || (*(int *)(this + 0xb4) == 0)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshChannelControl.cpp"
               ,0x26);
  }
  (**(code **)(*(long *)this + 0x30))(this);
  TPZMHMixedMeshControl::CreateHDivMHMMesh((TPZMHMixedMeshControl *)this);
  if (OpenChannel) {
    local_40 = (_Rb_tree_node_base *)(oppen_channel + 8);
    p_Var13 = *(_Rb_tree_node_base **)(oppen_channel + 0x18);
    local_48 = (TPZMHMixedMeshControl *)this;
    while (pTVar7 = local_48, this = (TPZMHMixedMeshChannelControl *)local_48, p_Var13 != local_40)
    {
      p_Var1 = p_Var13[1]._M_left;
      iVar17 = *(int *)&p_Var13[1]._M_right;
      p_Var2 = p_Var13[2]._M_parent;
      iVar16 = *(int *)&p_Var13[2]._M_left;
      local_38 = p_Var13;
      TPZGeoMesh::ResetReference(((local_48->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
      local_58.fRef = (pTVar7->fFluxMesh).fRef;
      LOCK();
      ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZCompMesh::LoadReferences((local_58.fRef)->fPointer);
      TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_58);
      p_Var1 = p_Var1[1]._M_left;
      p_Var2 = p_Var2[1]._M_left;
      plVar3 = (pTVar7->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore;
      if ((int)plVar3[(long)p_Var1] == (int)plVar3[(long)p_Var2]) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshChannelControl.cpp"
                   ,0x36);
      }
      pTVar8 = TPZGeoMesh::Element(((pTVar7->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                   (int64_t)p_Var1);
      pTVar9 = TPZGeoMesh::Element(((pTVar7->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                   (int64_t)p_Var2);
      pTVar4 = pTVar8->fReference;
      pTVar5 = pTVar9->fReference;
      iVar17 = iVar17 + -4;
      iVar16 = iVar16 + -4;
      lVar10 = (**(code **)(*(long *)pTVar4 + 0xa0))(pTVar4,iVar17);
      lVar11 = (**(code **)(*(long *)pTVar5 + 0xa0))(pTVar5,iVar16);
      if (lVar10 == lVar11) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshChannelControl.cpp"
                   ,0x42);
      }
      this_00 = (TPZConnect *)(**(code **)(*(long *)pTVar4 + 0xa8))(pTVar4,iVar17);
      this_01 = (TPZConnect *)(**(code **)(*(long *)pTVar5 + 0xa8))(pTVar5,iVar16);
      TPZConnect::RemoveDepend(this_00);
      TPZConnect::RemoveDepend(this_01);
      uVar12 = (**(code **)(*(long *)pTVar4 + 0xa0))(pTVar4,iVar17);
      (**(code **)(*(long *)pTVar5 + 0x208))(pTVar5,iVar16,uVar12);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
    }
  }
  (**(code **)(*(long *)((((TPZMHMixedMeshControl *)this)->fFluxMesh).fRef)->fPointer + 0x88))();
  (**(code **)(*(long *)((((TPZMHMixedMeshControl *)this)->fFluxMesh).fRef)->fPointer + 0x60))();
  (*(((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0xc])(this);
  (*(((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x10])(this);
  TPZMHMixedMeshControl::CreateHDivPressureMHMMesh((TPZMHMixedMeshControl *)this);
  poVar14 = std::operator<<((ostream *)&std::cout,"Total number of equations ");
  poVar14 = std::ostream::_M_insert<long>((long)poVar14);
  std::endl<char,std::char_traits<char>>(poVar14);
  iVar15 = TPZCompMesh::NEquations
                     (((((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fCMesh.fRef)->
                      fPointer);
  (((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fGlobalSystemWithLocalCondensationSize =
       iVar15;
  pTVar6 = ((((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  (((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fGlobalSystemSize =
       ((pTVar6->fSolution).fBaseMatrix)->fRow;
  (**(code **)(*(long *)pTVar6 + 0x78))();
  if ((char)local_4c != '\0') {
    HideTheElements(this);
  }
  iVar15 = TPZCompMesh::NEquations
                     (((((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fCMesh.fRef)->
                      fPointer);
  (((TPZMHMixedMeshControl *)this)->super_TPZMHMeshControl).fNumeq = iVar15;
  return;
}

Assistant:

void TPZMHMixedMeshChannelControl::BuildComputationalMesh(bool usersubstructure,bool OpenChannel,std::map<int,std::pair<TPZGeoElSide,TPZGeoElSide>> oppen_channel){
 
    
    if (fpOrderInternal == 0 || fpOrderSkeleton == 0) {
        DebugStop();
    }
    InsertPeriferalMaterialObjects();
    CreateHDivMHMMesh();
    
    if(OpenChannel==true){
        for(auto it:oppen_channel){
            fGMesh->ResetReference();
            FluxMesh()->LoadReferences();
            TPZGeoEl *gel_from_orig = it.second.first.Element();
            int side_from = it.second.first.Side();
            TPZGeoEl *gel_to_orig = it.second.second.Element();
            int64_t gel_from_index = gel_from_orig->Index();
            int64_t gel_to_index = gel_to_orig->Index();
            int mhm1 = fGeoToMHMDomain[gel_from_index];
            int mhm2 = fGeoToMHMDomain[gel_to_index];
            if(mhm1 == mhm2) DebugStop();
            TPZGeoEl *gel_from = fGMesh->Element(gel_from_index);
            TPZGeoEl *gel_to = fGMesh->Element(gel_to_index);
            TPZCompEl *cel_from = gel_from->Reference();
            TPZCompEl *cel_to = gel_to->Reference();
            int side_to = it.second.second.Side();
            int c_from_index = cel_from->Index();
            int c_to_index = cel_to->Index();
            int connec_from_index = side_from - 4;
            int connec_to_index = side_to - 4;
            int64_t cfrom_index = cel_from->ConnectIndex(connec_from_index);
            int64_t cto_index = cel_to->ConnectIndex(connec_to_index);
            if(cfrom_index == cto_index) DebugStop();
            TPZConnect &cfrom = cel_from->Connect(connec_from_index);
            TPZConnect &cto = cel_to->Connect(connec_to_index);
            cfrom.RemoveDepend();
            cto.RemoveDepend();
    //        FluxMesh()->Element(c_from_index)->Connect(connec_from_index).RemoveDepend();
    //        FluxMesh()->Element(c_to_index)->Connect(connec_to_index).RemoveDepend();
            auto conenec_from_to = cel_from->ConnectIndex(connec_from_index);
            cel_to->SetConnectIndex(connec_to_index, conenec_from_to);
        }
    }
    

        
    
    fFluxMesh->CleanUpUnconnectedNodes();
    fFluxMesh->ExpandSolution();
    InsertPeriferalPressureMaterialObjects();
    
#ifdef PZDEBUG
    if (fFluxMesh->Dimension() != fGMesh->Dimension()) {
        DebugStop();
    }
#endif
    
    CreatePressureMHMMesh();
    
    
    CreateHDivPressureMHMMesh();
    std::cout << "Total number of equations " << fCMesh->Solution().Rows() << std::endl;
    fGlobalSystemWithLocalCondensationSize = fCMesh->NEquations();
    fGlobalSystemSize = fCMesh->Solution().Rows();
    
    fCMesh->ComputeNodElCon();
#ifdef PZDEBUG
    {
        std::ofstream out("Friendly.txt");
        PrintFriendly(out);
    }
    CheckMeshConsistency();
#endif
    
    if (usersubstructure) {
        HideTheElements();
    }
    fNumeq = fCMesh->NEquations();
#ifdef PZDEBUG2
    {
        int64_t nel = fCMesh->NElements();
        for(int64_t el = 0; el<nel; el++)
        {
            TPZCompEl *cel = fCMesh->Element(el);
            TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
            if(sub)
            {
                std::stringstream sout;
                sout << "submesh_" << el << ".vtk";
                std::ofstream file(sout.str());
                TPZVTKGeoMesh::PrintCMeshVTK(sub, file,true);
            }
        }
        fCMesh->LoadReferences();
        std::ofstream out("cmesh_substruct.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(fCMesh->Reference(), out,true);
    }
#endif

}